

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall
Json::Reader::decodeUnicodeCodePoint
          (Reader *this,Token *token,Location *current,Location end,uint *unicode)

{
  char *pcVar1;
  bool bVar2;
  uint surrogatePair;
  uint local_54;
  string local_50;
  
  bVar2 = decodeUnicodeEscapeSequence(this,token,current,end,unicode);
  if (bVar2) {
    if ((*unicode & 0xfffffc00) != 0xd800) {
      return true;
    }
    pcVar1 = *current;
    if ((long)end - (long)pcVar1 < 6) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 "additional six characters expected to parse unicode surrogate pair.","");
      addError(this,&local_50,token,*current);
    }
    else {
      *current = pcVar1 + 1;
      if ((*pcVar1 == '\\') && (*current = pcVar1 + 2, pcVar1[1] == 'u')) {
        bVar2 = decodeUnicodeEscapeSequence(this,token,current,end,&local_54);
        if (!bVar2) {
          return false;
        }
        *unicode = (*unicode & 0x3ff) * 0x400 + (local_54 & 0x3ff) + 0x10000;
        return true;
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 "expecting another \\u token to begin the second half of a unicode surrogate pair",
                 "");
      addError(this,&local_50,token,*current);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return false;
}

Assistant:

bool
Reader::decodeUnicodeCodePoint( Token &token, 
                                     Location &current, 
                                     Location end, 
                                     unsigned int &unicode )
{

   if ( !decodeUnicodeEscapeSequence( token, current, end, unicode ) )
      return false;
   if (unicode >= 0xD800 && unicode <= 0xDBFF)
   {
      // surrogate pairs
      if (end - current < 6)
         return addError( "additional six characters expected to parse unicode surrogate pair.", token, current );
      unsigned int surrogatePair;
      if (*(current++) == '\\' && *(current++)== 'u')
      {
         if (decodeUnicodeEscapeSequence( token, current, end, surrogatePair ))
         {
            unicode = 0x10000 + ((unicode & 0x3FF) << 10) + (surrogatePair & 0x3FF);
         } 
         else
            return false;
      } 
      else
         return addError( "expecting another \\u token to begin the second half of a unicode surrogate pair", token, current );
   }
   return true;
}